

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

Expr * substExpr(SubstContext *pSubst,Expr *pExpr)

{
  byte *pbVar1;
  u8 uVar2;
  short sVar3;
  int iVar4;
  Select *pSVar5;
  sqlite3 *db;
  Window *pWVar6;
  ExprList *pEVar7;
  int iVar8;
  Expr *pEVar9;
  CollSeq *pCVar10;
  CollSeq *pCVar11;
  u8 uVar12;
  uint uVar13;
  Select *pSVar14;
  char *zC;
  ExprList **ppEVar15;
  ExprList_item *pEVar16;
  long lVar17;
  long in_FS_OFFSET;
  Expr ifNullRow;
  undefined1 *local_88;
  anon_union_8_2_443a03b8_for_u aStack_80;
  Expr *local_78;
  Expr *pEStack_70;
  anon_union_8_2_a01b6dbf_for_x local_68;
  undefined1 *puStack_60;
  undefined1 *local_58;
  AggInfo *pAStack_50;
  anon_union_8_3_c79b3df9_for_y local_48;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  if (pExpr == (Expr *)0x0) {
    pExpr = (Expr *)0x0;
    goto LAB_00191ca1;
  }
  if (((pExpr->flags & 3) != 0) && ((pExpr->w).iJoin == pSubst->iTable)) {
    pExpr->w = (anon_union_4_2_009eaf8f_for_w)pSubst->iNewTable;
  }
  if (pExpr->op == 0xb3) {
    if (pExpr->iTable == pSubst->iTable) {
      pExpr->iTable = pSubst->iNewTable;
    }
  }
  else if (((pExpr->op == 0xa8) && ((pExpr->flags & 0x20) == 0)) &&
          (pExpr->iTable == pSubst->iTable)) {
    local_48.pTab = (Table *)&DAT_aaaaaaaaaaaaaaaa;
    local_58 = &DAT_aaaaaaaaaaaaaaaa;
    pAStack_50 = (AggInfo *)&DAT_aaaaaaaaaaaaaaaa;
    local_68.pList = (ExprList *)&DAT_aaaaaaaaaaaaaaaa;
    puStack_60 = &DAT_aaaaaaaaaaaaaaaa;
    local_78 = (Expr *)&DAT_aaaaaaaaaaaaaaaa;
    pEStack_70 = (Expr *)&DAT_aaaaaaaaaaaaaaaa;
    local_88 = &DAT_aaaaaaaaaaaaaaaa;
    aStack_80.zToken = &DAT_aaaaaaaaaaaaaaaa;
    sVar3 = pExpr->iColumn;
    pSVar5 = (Select *)pSubst->pEList->a[sVar3].pExpr;
    uVar2 = pSVar5->op;
    uVar12 = uVar2;
    if (uVar2 == 0xb0) {
      uVar12 = *(u8 *)&pSVar5->nSelectRow;
    }
    pSVar14 = pSVar5;
    if (uVar12 == 0xb1) {
LAB_00191a2d:
      if (1 < ((anon_union_8_2_a01b6dbf_for_x *)&pSVar14->pEList)->pList->nExpr) {
        sqlite3VectorErrorMsg(pSubst->pParse,(Expr *)pSVar5);
        goto LAB_00191ca1;
      }
    }
    else if (uVar12 == 0x8b) {
      pSVar14 = ((anon_union_8_2_a01b6dbf_for_x *)&pSVar5->pEList)->pSelect;
      goto LAB_00191a2d;
    }
    db = pSubst->pParse->db;
    pSVar14 = pSVar5;
    if (pSubst->isOuterJoin != 0) {
      if (uVar2 == 0xa8) {
        uVar13 = pSubst->iNewTable;
        if (*(uint *)((long)&pSVar5->pSrc + 4) == uVar13) goto LAB_00191bc8;
      }
      else {
        uVar13 = pSubst->iNewTable;
      }
      aStack_80.zToken = (char *)0x0;
      pEStack_70 = (Expr *)0x0;
      local_68.pList = (ExprList *)0x0;
      pAStack_50 = (AggInfo *)0x0;
      local_48.pTab = (Table *)0x0;
      puStack_60 = (undefined1 *)((ulong)uVar13 << 0x20);
      local_58 = (undefined1 *)0xff9d;
      local_88 = (undefined1 *)0x40000000000b3;
      pSVar14 = (Select *)&local_88;
      local_78 = (Expr *)pSVar5;
    }
LAB_00191bc8:
    pEVar9 = exprDup(db,(Expr *)pSVar14,0,(EdupBuf *)0x0);
    if (db->mallocFailed == '\0') {
      if (pSubst->isOuterJoin != 0) {
        pbVar1 = (byte *)((long)&pEVar9->flags + 2);
        *pbVar1 = *pbVar1 | 0x20;
      }
      if (pEVar9->op == 0xab) {
        iVar8 = sqlite3ExprTruthValue(pEVar9);
        (pEVar9->u).iValue = iVar8;
        pEVar9->op = 0x9c;
        pbVar1 = (byte *)((long)&pEVar9->flags + 1);
        *pbVar1 = *pbVar1 | 8;
      }
      pCVar10 = sqlite3ExprCollSeq(pSubst->pParse,pEVar9);
      pCVar11 = sqlite3ExprCollSeq(pSubst->pParse,pSubst->pCList->a[sVar3].pExpr);
      if ((pCVar10 != pCVar11) || ((pEVar9->op != 'r' && (pEVar9->op != 0xa8)))) {
        if (pCVar11 == (CollSeq *)0x0) {
          zC = "BINARY";
        }
        else {
          zC = pCVar11->zName;
        }
        pEVar9 = sqlite3ExprAddCollateString(pSubst->pParse,pEVar9,zC);
      }
      pbVar1 = (byte *)((long)&pEVar9->flags + 1);
      *pbVar1 = *pbVar1 & 0xfd;
      uVar13 = pExpr->flags & 3;
      if (uVar13 != 0) {
        sqlite3SetJoinExpr(pEVar9,(pExpr->w).iJoin,uVar13);
      }
      sqlite3ExprDeleteNN(db,pExpr);
      pExpr = pEVar9;
    }
    else if (pEVar9 != (Expr *)0x0) {
      sqlite3ExprDeleteNN(db,pEVar9);
    }
    goto LAB_00191ca1;
  }
  pEVar9 = substExpr(pSubst,pExpr->pLeft);
  pExpr->pLeft = pEVar9;
  pEVar9 = substExpr(pSubst,pExpr->pRight);
  pExpr->pRight = pEVar9;
  pSVar5 = (Select *)(pExpr->x).pList;
  if ((pExpr->flags & 0x1000) == 0) {
    if ((pSVar5 != (Select *)0x0) &&
       (iVar8._0_1_ = pSVar5->op, iVar8._1_1_ = pSVar5->field_0x1, iVar8._2_2_ = pSVar5->nSelectRow,
       0 < iVar8)) {
      ppEVar15 = (ExprList **)&pSVar5->iLimit;
      lVar17 = 0;
      do {
        pEVar9 = substExpr(pSubst,(Expr *)*ppEVar15);
        *ppEVar15 = (ExprList *)pEVar9;
        lVar17 = lVar17 + 1;
        iVar4._0_1_ = pSVar5->op;
        iVar4._1_1_ = pSVar5->field_0x1;
        iVar4._2_2_ = pSVar5->nSelectRow;
        ppEVar15 = ppEVar15 + 3;
      } while (lVar17 < iVar4);
    }
  }
  else {
    substSelect(pSubst,pSVar5,1);
  }
  if ((pExpr->flags & 0x1000000) != 0) {
    pWVar6 = (pExpr->y).pWin;
    pEVar9 = substExpr(pSubst,pWVar6->pFilter);
    pWVar6->pFilter = pEVar9;
    pEVar7 = pWVar6->pPartition;
    if ((pEVar7 != (ExprList *)0x0) && (0 < pEVar7->nExpr)) {
      pEVar16 = pEVar7->a;
      lVar17 = 0;
      do {
        pEVar9 = substExpr(pSubst,pEVar16->pExpr);
        pEVar16->pExpr = pEVar9;
        lVar17 = lVar17 + 1;
        pEVar16 = pEVar16 + 1;
      } while (lVar17 < pEVar7->nExpr);
    }
    pEVar7 = pWVar6->pOrderBy;
    if ((pEVar7 != (ExprList *)0x0) && (0 < pEVar7->nExpr)) {
      pEVar16 = pEVar7->a;
      lVar17 = 0;
      do {
        pEVar9 = substExpr(pSubst,pEVar16->pExpr);
        pEVar16->pExpr = pEVar9;
        lVar17 = lVar17 + 1;
        pEVar16 = pEVar16 + 1;
      } while (lVar17 < pEVar7->nExpr);
    }
  }
LAB_00191ca1:
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return pExpr;
}

Assistant:

static Expr *substExpr(
  SubstContext *pSubst,  /* Description of the substitution */
  Expr *pExpr            /* Expr in which substitution occurs */
){
  if( pExpr==0 ) return 0;
  if( ExprHasProperty(pExpr, EP_OuterON|EP_InnerON)
   && pExpr->w.iJoin==pSubst->iTable
  ){
    testcase( ExprHasProperty(pExpr, EP_InnerON) );
    pExpr->w.iJoin = pSubst->iNewTable;
  }
  if( pExpr->op==TK_COLUMN
   && pExpr->iTable==pSubst->iTable
   && !ExprHasProperty(pExpr, EP_FixedCol)
  ){
#ifdef SQLITE_ALLOW_ROWID_IN_VIEW
    if( pExpr->iColumn<0 ){
      pExpr->op = TK_NULL;
    }else
#endif
    {
      Expr *pNew;
      int iColumn;
      Expr *pCopy;
      Expr ifNullRow;
      iColumn = pExpr->iColumn;
      assert( iColumn>=0 );
      assert( pSubst->pEList!=0 && iColumn<pSubst->pEList->nExpr );
      assert( pExpr->pRight==0 );
      pCopy = pSubst->pEList->a[iColumn].pExpr;
      if( sqlite3ExprIsVector(pCopy) ){
        sqlite3VectorErrorMsg(pSubst->pParse, pCopy);
      }else{
        sqlite3 *db = pSubst->pParse->db;
        if( pSubst->isOuterJoin
         && (pCopy->op!=TK_COLUMN || pCopy->iTable!=pSubst->iNewTable)
        ){
          memset(&ifNullRow, 0, sizeof(ifNullRow));
          ifNullRow.op = TK_IF_NULL_ROW;
          ifNullRow.pLeft = pCopy;
          ifNullRow.iTable = pSubst->iNewTable;
          ifNullRow.iColumn = -99;
          ifNullRow.flags = EP_IfNullRow;
          pCopy = &ifNullRow;
        }
        testcase( ExprHasProperty(pCopy, EP_Subquery) );
        pNew = sqlite3ExprDup(db, pCopy, 0);
        if( db->mallocFailed ){
          sqlite3ExprDelete(db, pNew);
          return pExpr;
        }
        if( pSubst->isOuterJoin ){
          ExprSetProperty(pNew, EP_CanBeNull);
        }
        if( pNew->op==TK_TRUEFALSE ){
          pNew->u.iValue = sqlite3ExprTruthValue(pNew);
          pNew->op = TK_INTEGER;
          ExprSetProperty(pNew, EP_IntValue);
        }

        /* Ensure that the expression now has an implicit collation sequence,
        ** just as it did when it was a column of a view or sub-query. */
        {
          CollSeq *pNat = sqlite3ExprCollSeq(pSubst->pParse, pNew);
          CollSeq *pColl = sqlite3ExprCollSeq(pSubst->pParse,
                pSubst->pCList->a[iColumn].pExpr
          );
          if( pNat!=pColl || (pNew->op!=TK_COLUMN && pNew->op!=TK_COLLATE) ){
            pNew = sqlite3ExprAddCollateString(pSubst->pParse, pNew,
                (pColl ? pColl->zName : "BINARY")
            );
          }
        }
        ExprClearProperty(pNew, EP_Collate);
        if( ExprHasProperty(pExpr,EP_OuterON|EP_InnerON) ){
          sqlite3SetJoinExpr(pNew, pExpr->w.iJoin,
                             pExpr->flags & (EP_OuterON|EP_InnerON));
        }
        sqlite3ExprDelete(db, pExpr);
        pExpr = pNew;
      }
    }
  }else{
    if( pExpr->op==TK_IF_NULL_ROW && pExpr->iTable==pSubst->iTable ){
      pExpr->iTable = pSubst->iNewTable;
    }
    pExpr->pLeft = substExpr(pSubst, pExpr->pLeft);
    pExpr->pRight = substExpr(pSubst, pExpr->pRight);
    if( ExprUseXSelect(pExpr) ){
      substSelect(pSubst, pExpr->x.pSelect, 1);
    }else{
      substExprList(pSubst, pExpr->x.pList);
    }
#ifndef SQLITE_OMIT_WINDOWFUNC
    if( ExprHasProperty(pExpr, EP_WinFunc) ){
      Window *pWin = pExpr->y.pWin;
      pWin->pFilter = substExpr(pSubst, pWin->pFilter);
      substExprList(pSubst, pWin->pPartition);
      substExprList(pSubst, pWin->pOrderBy);
    }
#endif
  }
  return pExpr;
}